

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O1

int rops_callback_on_writable_ws(lws *wsi)

{
  int iVar1;
  lws *plVar2;
  
  if ((wsi->wsistate & 0xf000000) == 0x1000000) {
    plVar2 = rops_encapsulation_parent_h2(wsi);
    if (plVar2 == (lws *)0x0) {
      __assert_fail("enc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                    ,0x783,"int rops_callback_on_writable_ws(struct lws *)");
    }
    iVar1 = (*plVar2->role_ops->callback_on_writable)(wsi);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
rops_callback_on_writable_ws(struct lws *wsi)
{
#if defined(LWS_WITH_HTTP2)
	if (lwsi_role_h2_ENCAPSULATION(wsi)) {
		/* we know then that it has an h2 parent */
		struct lws *enc = role_ops_h2.encapsulation_parent(wsi);

		assert(enc);
		if (enc->role_ops->callback_on_writable(wsi))
			return 1;
	}
#endif
	return 0;
}